

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-ni.c
# Opt level: O0

void aes_cbc_ni_encrypt(ssh_cipher *ciph,void *vblk,int blklen,aes_ni_fn encrypt)

{
  uint8_t *puVar1;
  undefined4 in_register_00000014;
  __m128i *palVar2;
  ssh_cipheralg *extraout_XMM0_Qa;
  ssh_cipheralg *extraout_XMM0_Qb;
  __m128i alVar3;
  __m128i ciphertext;
  __m128i cipher_input;
  __m128i plaintext;
  uint8_t *finish;
  uint8_t *blk;
  aes_ni_context *ctx;
  aes_ni_fn encrypt_local;
  int blklen_local;
  void *vblk_local;
  ssh_cipher *ciph_local;
  
  palVar2 = (__m128i *)CONCAT44(in_register_00000014,blklen);
  puVar1 = (uint8_t *)((long)vblk + (long)blklen);
  for (finish = (uint8_t *)vblk; finish < puVar1; finish = finish + 0x10) {
    alVar3[1] = (longlong)vblk;
    alVar3[0] = (longlong)(ciph + -0x3f);
    alVar3 = (*encrypt)(alVar3,palVar2);
    palVar2 = alVar3[1];
    *(ssh_cipheralg **)finish = extraout_XMM0_Qa;
    *(ssh_cipheralg **)(finish + 8) = extraout_XMM0_Qb;
    ciph[-3].vt = extraout_XMM0_Qa;
    ciph[-2].vt = extraout_XMM0_Qb;
  }
  return;
}

Assistant:

static inline void aes_cbc_ni_encrypt(
    ssh_cipher *ciph, void *vblk, int blklen, aes_ni_fn encrypt)
{
    aes_ni_context *ctx = container_of(ciph, aes_ni_context, ciph);

    for (uint8_t *blk = (uint8_t *)vblk, *finish = blk + blklen;
         blk < finish; blk += 16) {
        __m128i plaintext = _mm_loadu_si128((const __m128i *)blk);
        __m128i cipher_input = _mm_xor_si128(plaintext, ctx->iv);
        __m128i ciphertext = encrypt(cipher_input, ctx->keysched_e);
        _mm_storeu_si128((__m128i *)blk, ciphertext);
        ctx->iv = ciphertext;
    }
}